

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranParserImpl.cxx
# Opt level: O2

bool __thiscall
cmFortranParser_s::FindIncludeFile
          (cmFortranParser_s *this,char *dir,char *includeName,string *fileName)

{
  pointer pbVar1;
  bool bVar2;
  pointer pbVar3;
  char *includeName_local;
  string *local_d8;
  string fullName;
  cmAlphaNum local_b0;
  cmAlphaNum local_80;
  string local_50;
  
  includeName_local = includeName;
  bVar2 = cmsys::SystemTools::FileIsFullPath(includeName);
  if (bVar2) {
    std::__cxx11::string::assign((char *)fileName);
    bVar2 = cmsys::SystemTools::FileExists(fileName,true);
    return bVar2;
  }
  local_80.View_._M_len = strlen(dir);
  local_b0.View_._M_str = local_b0.Digits_;
  local_b0.View_._M_len = 1;
  local_b0.Digits_[0] = '/';
  local_80.View_._M_str = dir;
  cmStrCat<char_const*>(&fullName,&local_80,&local_b0,&includeName_local);
  bVar2 = cmsys::SystemTools::FileExists(&fullName,true);
  if (bVar2) {
    bVar2 = true;
    std::__cxx11::string::_M_assign((string *)fileName);
  }
  else {
    pbVar3 = (this->IncludePath).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (this->IncludePath).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_d8 = fileName;
    do {
      if (pbVar3 == pbVar1) {
        bVar2 = false;
        goto LAB_002c2e36;
      }
      local_80.View_._M_str = (pbVar3->_M_dataplus)._M_p;
      local_80.View_._M_len = pbVar3->_M_string_length;
      local_b0.View_._M_len = 1;
      local_b0.View_._M_str = local_b0.Digits_;
      local_b0.Digits_[0] = '/';
      cmStrCat<char_const*>(&local_50,&local_80,&local_b0,&includeName_local);
      std::__cxx11::string::operator=((string *)&fullName,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      bVar2 = cmsys::SystemTools::FileExists(&fullName,true);
      pbVar3 = pbVar3 + 1;
    } while (!bVar2);
    bVar2 = true;
    std::__cxx11::string::_M_assign((string *)local_d8);
  }
LAB_002c2e36:
  std::__cxx11::string::~string((string *)&fullName);
  return bVar2;
}

Assistant:

bool cmFortranParser_s::FindIncludeFile(const char* dir,
                                        const char* includeName,
                                        std::string& fileName)
{
  // If the file is a full path, include it directly.
  if (cmSystemTools::FileIsFullPath(includeName)) {
    fileName = includeName;
    return cmSystemTools::FileExists(fileName, true);
  }
  // Check for the file in the directory containing the including
  // file.
  std::string fullName = cmStrCat(dir, '/', includeName);
  if (cmSystemTools::FileExists(fullName, true)) {
    fileName = fullName;
    return true;
  }

  // Search the include path for the file.
  for (std::string const& i : this->IncludePath) {
    fullName = cmStrCat(i, '/', includeName);
    if (cmSystemTools::FileExists(fullName, true)) {
      fileName = fullName;
      return true;
    }
  }
  return false;
}